

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O1

IShaderResourceVariable * __thiscall
Diligent::ShaderVariableManagerGL::
GetResourceByName<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
          (ShaderVariableManagerGL *this,Char *Name)

{
  int iVar1;
  StorageBufferBindInfo *pSVar2;
  PipelineResourceDesc *pPVar3;
  Uint32 ResIndex;
  Uint32 UVar4;
  
  UVar4 = (Uint32)(((ulong)this->m_VariableEndOffset - (ulong)this->m_StorageBufferOffset) / 0x18);
  if (UVar4 != 0) {
    ResIndex = 0;
    do {
      pSVar2 = GetResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>(this,ResIndex);
      pPVar3 = GetResourceDesc((pSVar2->
                               super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                               ).
                               super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                               .m_ParentManager,
                               (pSVar2->
                               super_GLVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                               ).
                               super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                               .m_ResIndex);
      iVar1 = strcmp(pPVar3->Name,Name);
      if (iVar1 == 0) {
        return (IShaderResourceVariable *)pSVar2;
      }
      ResIndex = ResIndex + 1;
    } while (UVar4 != ResIndex);
  }
  return (IShaderResourceVariable *)0x0;
}

Assistant:

void ShaderVariableManagerGL::UniformBuffBindInfo::SetDynamicOffset(Uint32 ArrayIndex, Uint32 Offset)
{
    const auto& Attr = GetAttribs();
    const auto& Desc = GetDesc();
    VERIFY_EXPR(Desc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER);
#ifdef DILIGENT_DEVELOPMENT
    {
        const auto& CachedUB = m_ParentManager.m_ResourceCache.GetConstUB(Attr.CacheOffset + ArrayIndex);
        VerifyDynamicBufferOffset<BufferGLImpl, BufferViewGLImpl>(Desc, CachedUB.pBuffer, CachedUB.BaseOffset, CachedUB.RangeSize, Offset);
    }
#endif
    m_ParentManager.m_ResourceCache.SetDynamicUBOffset(Attr.CacheOffset + ArrayIndex, Offset);
}